

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_text_colored(nk_context *ctx,char *str,int len,nk_flags alignment,nk_color color)

{
  long in_RDI;
  undefined4 in_R8D;
  nk_flags unaff_retaddr;
  nk_text *in_stack_00000008;
  nk_text text;
  nk_rect bounds;
  nk_vec2 item_padding;
  nk_style *style;
  nk_window *win;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_fffffffffffffff8;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x3fc8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0) != 0)) {
    nk_panel_alloc_space
              ((nk_rect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (nk_context *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    nk_widget_text((nk_command_buffer *)bounds._0_8_,stack0x00000028,(char *)text._8_8_,
                   (int)text.padding.y,in_stack_00000008,unaff_retaddr,
                   (nk_user_font *)CONCAT44(in_R8D,in_stack_fffffffffffffff8));
  }
  return;
}

Assistant:

NK_API void
nk_text_colored(struct nk_context *ctx, const char *str, int len,
    nk_flags alignment, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text(&win->buffer, bounds, str, len, &text, alignment, style->font);
}